

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV3MeshNormalListBlock(Parser *this,Mesh *sMesh)

{
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_00;
  byte bVar1;
  pointer paVar2;
  pointer pFVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  Logger *this_01;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  char *message;
  ulong uVar10;
  uint index;
  uint faceIdx;
  value_type local_48;
  uint local_3c;
  int local_38;
  uint local_34;
  
  this_00 = &(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (this_00,((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x2e8ba2e8ba2e8ba3,
             &local_48);
  local_34 = 0xffffffff;
  pbVar9 = (byte *)this->filePtr;
  local_38 = 0;
  uVar10 = 0xffffffff;
  do {
    bVar1 = *pbVar9;
    if (bVar1 == 0x2a) {
      do {
        pbVar8 = pbVar9 + 1;
        this->filePtr = (char *)pbVar8;
        if (((int)uVar10 == -1) ||
           (iVar5 = strncmp("MESH_VERTEXNORMAL",(char *)pbVar8,0x11), iVar5 != 0)) {
LAB_004042b1:
          iVar5 = strncmp("MESH_FACENORMAL",(char *)pbVar8,0xf);
          if (iVar5 != 0) break;
          bVar1 = pbVar9[0x10];
          if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
          pbVar8 = pbVar9 + 0x11;
          if (bVar1 == 0) {
            pbVar8 = pbVar9 + 0x10;
          }
          this->filePtr = (char *)pbVar8;
          local_48.x = 0.0;
          local_48.y = 0.0;
          local_48.z = 0.0;
          ParseLV4MeshFloatTriple(this,&local_48.x,&local_34);
          uVar10 = (ulong)local_34;
          uVar6 = ((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                         super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                         super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2) * 0xf83e0f83e0f83e1;
          if (uVar6 < uVar10 || uVar6 - uVar10 == 0) {
            this_01 = DefaultLogger::get();
            message = "ASE: Invalid vertex index in MESH_FACENORMAL section";
LAB_00404418:
            Logger::error(this_01,message);
          }
          else {
            uVar7 = local_34 * 3;
            paVar2 = (this_00->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar2[uVar7].x = local_48.x + paVar2[uVar7].x;
            paVar2[uVar7].y = local_48.y + paVar2[uVar7].y;
            paVar2[uVar7].z = local_48.z + paVar2[uVar7].z;
            uVar6 = uVar10 * 3 + 1 & 0xffffffff;
            paVar2 = (this_00->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar2[uVar6].x = local_48.x + paVar2[uVar6].x;
            paVar2[uVar6].y = local_48.y + paVar2[uVar6].y;
            paVar2[uVar6].z = local_48.z + paVar2[uVar6].z;
            uVar6 = uVar10 * 3 + 2 & 0xffffffff;
            paVar2 = (this_00->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar2[uVar6].x = local_48.x + paVar2[uVar6].x;
            paVar2[uVar6].y = local_48.y + paVar2[uVar6].y;
            paVar2[uVar6].z = local_48.z + paVar2[uVar6].z;
          }
        }
        else {
          bVar1 = pbVar9[0x12];
          if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
          goto LAB_004042b1;
          pbVar8 = pbVar9 + 0x13;
          if (bVar1 == 0) {
            pbVar8 = pbVar9 + 0x12;
          }
          this->filePtr = (char *)pbVar8;
          local_48.x = 0.0;
          local_48.y = 0.0;
          local_48.z = 0.0;
          ParseLV4MeshFloatTriple(this,&local_48.x,&local_3c);
          pFVar3 = (sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                   super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar6 = ((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                         super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 2) *
                  0xf83e0f83e0f83e1;
          if (uVar10 <= uVar6 && uVar6 - uVar10 != 0) {
            if (local_3c == pFVar3[uVar10].super_FaceWithSmoothingGroup.mIndices[0]) {
              local_3c = 0;
              iVar5 = 0;
LAB_004044e7:
              uVar7 = (int)uVar10 * 3 + iVar5;
              paVar2 = (this_00->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar2[uVar7].x = local_48.x + paVar2[uVar7].x;
              paVar2[uVar7].y = local_48.y + paVar2[uVar7].y;
              paVar2[uVar7].z = local_48.z + paVar2[uVar7].z;
              goto LAB_00404527;
            }
            if (local_3c == pFVar3[uVar10].super_FaceWithSmoothingGroup.mIndices[1]) {
              local_3c = 1;
              iVar5 = 1;
              goto LAB_004044e7;
            }
            if (local_3c == pFVar3[uVar10].super_FaceWithSmoothingGroup.mIndices[2]) {
              local_3c = 2;
              iVar5 = 2;
              goto LAB_004044e7;
            }
            this_01 = DefaultLogger::get();
            message = "ASE: Invalid vertex index in MESH_VERTEXNORMAL section";
            goto LAB_00404418;
          }
        }
LAB_00404527:
        pbVar9 = (byte *)this->filePtr;
        pbVar8 = pbVar9;
      } while (*pbVar9 == 0x2a);
      pbVar9 = pbVar8;
      bVar1 = *pbVar9;
    }
    bVar4 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        iVar5 = local_38;
        if (this->bLastWasEndLine != false) goto LAB_0040459a;
        this->iLineNumber = this->iLineNumber + 1;
        bVar4 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_NORMALS chunk (Level 3)");
      }
    }
    else {
      if (bVar1 == 0x7d) {
        iVar5 = local_38 + -1;
        if (local_38 + -1 == 0) {
          this->filePtr = (char *)(pbVar9 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_0040459c;
        iVar5 = local_38 + 1;
      }
LAB_0040459a:
      local_38 = iVar5;
      bVar4 = false;
    }
LAB_0040459c:
    this->bLastWasEndLine = bVar4;
    pbVar9 = pbVar9 + 1;
    this->filePtr = (char *)pbVar9;
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshNormalListBlock(ASE::Mesh& sMesh)
{
    AI_ASE_PARSER_INIT();

    // Allocate enough storage for the normals
    sMesh.mNormals.resize(sMesh.mFaces.size()*3,aiVector3D( 0.f, 0.f, 0.f ));
    unsigned int index, faceIdx = UINT_MAX;

    // FIXME: rewrite this and find out how to interpret the normals
    // correctly. This is crap.

    // Smooth the vertex and face normals together. The result
    // will be edgy then, but otherwise everything would be soft ...
    while (true)    {
        if ('*' == *filePtr)    {
            ++filePtr;
            if (faceIdx != UINT_MAX && TokenMatch(filePtr,"MESH_VERTEXNORMAL",17))  {
                aiVector3D vNormal;
                ParseLV4MeshFloatTriple(&vNormal.x,index);
                if (faceIdx >=  sMesh.mFaces.size())
                    continue;

                // Make sure we assign it to the correct face
                const ASE::Face& face = sMesh.mFaces[faceIdx];
                if (index == face.mIndices[0])
                    index = 0;
                else if (index == face.mIndices[1])
                    index = 1;
                else if (index == face.mIndices[2])
                    index = 2;
                else    {
                    ASSIMP_LOG_ERROR("ASE: Invalid vertex index in MESH_VERTEXNORMAL section");
                    continue;
                }
                // We'll renormalize later
                sMesh.mNormals[faceIdx*3+index] += vNormal;
                continue;
            }
            if (TokenMatch(filePtr,"MESH_FACENORMAL",15))   {
                aiVector3D vNormal;
                ParseLV4MeshFloatTriple(&vNormal.x,faceIdx);

                if (faceIdx >= sMesh.mFaces.size()) {
                    ASSIMP_LOG_ERROR("ASE: Invalid vertex index in MESH_FACENORMAL section");
                    continue;
                }

                // We'll renormalize later
                sMesh.mNormals[faceIdx*3] += vNormal;
                sMesh.mNormals[faceIdx*3+1] += vNormal;
                sMesh.mNormals[faceIdx*3+2] += vNormal;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_NORMALS");
    }
    return;
}